

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_prtyd(DisasContext_conflict10 *ctx)

{
  TCGv_i64 a1;
  TCGContext_conflict10 *s;
  TCGv_i64 arg1;
  TCGv_i64 arg1_00;
  TCGTemp *ts;
  uintptr_t o_1;
  TCGv_i64 ret;
  uintptr_t o;
  
  s = ctx->uc->tcg_ctx;
  arg1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8));
  arg1_00 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)ts - (long)s);
  tcg_gen_shri_i64_ppc64(s,ret,arg1_00,0x20);
  a1 = arg1 + (long)&s->pool_cur;
  tcg_gen_op3_ppc64(s,INDEX_op_xor_i64,(TCGArg)a1,(TCGArg)(arg1_00 + (long)s),(TCGArg)ts);
  tcg_gen_shri_i64_ppc64(s,ret,arg1,0x10);
  tcg_gen_op3_ppc64(s,INDEX_op_xor_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts);
  tcg_gen_shri_i64_ppc64(s,ret,arg1,8);
  tcg_gen_op3_ppc64(s,INDEX_op_xor_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts);
  tcg_gen_andi_i64_ppc64(s,arg1,arg1,1);
  tcg_temp_free_internal_ppc64(s,ts);
  return;
}

Assistant:

static void gen_prtyd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv ra = cpu_gpr[rA(ctx->opcode)];
    TCGv rs = cpu_gpr[rS(ctx->opcode)];
    TCGv t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_shri_tl(tcg_ctx, t0, rs, 32);
    tcg_gen_xor_tl(tcg_ctx, ra, rs, t0);
    tcg_gen_shri_tl(tcg_ctx, t0, ra, 16);
    tcg_gen_xor_tl(tcg_ctx, ra, ra, t0);
    tcg_gen_shri_tl(tcg_ctx, t0, ra, 8);
    tcg_gen_xor_tl(tcg_ctx, ra, ra, t0);
    tcg_gen_andi_tl(tcg_ctx, ra, ra, 1);
    tcg_temp_free(tcg_ctx, t0);
}